

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

void __thiscall Entity::rotateClockwise(Entity *this)

{
  string *psVar1;
  ostream *poVar2;
  int iVar3;
  
  iVar3 = 0;
  if (this->rotation < 0x10e) {
    iVar3 = this->rotation + 0x5a;
  }
  this->rotation = iVar3;
  psVar1 = (string *)(**(code **)(*(long *)this + 0x40))();
  poVar2 = std::operator<<((ostream *)&std::cout,psVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Entity::rotateClockwise() {
    rotation = rotation < 270 ? (rotation + 90) : 0;
    cout << *toString() << endl;
}